

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestProgress::testVertBar(TestProgress *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Orientation OVar4;
  qsizetype qVar5;
  int local_140;
  int local_13c;
  int i_1;
  int i;
  undefined1 local_128 [8];
  QSignalSpy spy;
  undefined1 local_a0 [8];
  ProgressBar p;
  QVBoxLayout local_60 [8];
  QVBoxLayout l;
  QFlags<Qt::WindowType> local_3c;
  QWidget local_38 [8];
  QWidget w;
  TestProgress *this_local;
  
  QFlags<Qt::WindowType>::QFlags(&local_3c);
  QWidget::QWidget(local_38,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_3c.i);
  QVBoxLayout::QVBoxLayout(local_60);
  QWidget::setLayout((QLayout *)local_38);
  QtMWidgets::ProgressBar::ProgressBar((ProgressBar *)local_a0,(QWidget *)0x0);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&spy.field_0x7c);
  QBoxLayout::addWidget((QWidget *)local_60,(int)local_a0,(QFlags_conflict1 *)0x0);
  QWidget::show();
  bVar1 = QTest::qWaitForWindowActive(local_38,5000);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"QTest::qWaitForWindowActive( &w )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                         ,0x54);
  if ((bVar1 & 1) == 0) {
    spy.m_waiting = true;
    spy._121_3_ = 0;
  }
  else {
    QSignalSpy::QSignalSpy<void(QtMWidgets::ProgressBar::*)(int)>
              ((QSignalSpy *)local_128,(Object *)local_a0,0x1a4f60);
    QtMWidgets::ProgressBar::setMinimum((ProgressBar *)local_a0,0);
    QtMWidgets::ProgressBar::setMaximum((ProgressBar *)local_a0,100);
    QtMWidgets::ProgressBar::setValue((ProgressBar *)local_a0,1);
    QtMWidgets::ProgressBar::setOrientation((ProgressBar *)local_a0,Vertical);
    QWidget::resize(local_38,0x32,0x96);
    iVar3 = QtMWidgets::ProgressBar::minimum((ProgressBar *)local_a0);
    bVar1 = QTest::qVerify(iVar3 == 0,"p.minimum() == 0","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                           ,0x5f);
    if ((bVar1 & 1) == 0) {
      spy.m_waiting = true;
      spy._121_3_ = 0;
    }
    else {
      iVar3 = QtMWidgets::ProgressBar::maximum((ProgressBar *)local_a0);
      bVar1 = QTest::qVerify(iVar3 == 100,"p.maximum() == 100","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                             ,0x60);
      if ((bVar1 & 1) == 0) {
        spy.m_waiting = true;
        spy._121_3_ = 0;
      }
      else {
        iVar3 = QtMWidgets::ProgressBar::value((ProgressBar *)local_a0);
        bVar1 = QTest::qVerify(iVar3 == 1,"p.value() == 1","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                               ,0x61);
        if ((bVar1 & 1) == 0) {
          spy.m_waiting = true;
          spy._121_3_ = 0;
        }
        else {
          OVar4 = QtMWidgets::ProgressBar::orientation((ProgressBar *)local_a0);
          bVar1 = QTest::qVerify(OVar4 == Vertical,"p.orientation() == Qt::Vertical","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                 ,0x62);
          if ((bVar1 & 1) == 0) {
            spy.m_waiting = true;
            spy._121_3_ = 0;
          }
          else {
            bVar2 = QtMWidgets::ProgressBar::invertedAppearance((ProgressBar *)local_a0);
            bVar1 = QTest::qVerify((bool)(~bVar2 & 1),"p.invertedAppearance() == false","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                   ,99);
            if ((bVar1 & 1) == 0) {
              spy.m_waiting = true;
              spy._121_3_ = 0;
            }
            else {
              qVar5 = QList<QList<QVariant>_>::count((QList<QList<QVariant>_> *)&spy.field_0x8);
              bVar1 = QTest::qVerify(qVar5 == 1,"spy.count() == 1","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                     ,100);
              if ((bVar1 & 1) == 0) {
                spy.m_waiting = true;
                spy._121_3_ = 0;
              }
              else {
                local_13c = QtMWidgets::ProgressBar::minimum((ProgressBar *)local_a0);
                while( true ) {
                  iVar3 = QtMWidgets::ProgressBar::maximum((ProgressBar *)local_a0);
                  if (iVar3 < local_13c) break;
                  QtMWidgets::ProgressBar::setValue((ProgressBar *)local_a0,local_13c);
                  iVar3 = QtMWidgets::ProgressBar::value((ProgressBar *)local_a0);
                  bVar1 = QTest::qVerify(iVar3 == local_13c,"p.value() == i","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                         ,0x69);
                  if ((bVar1 & 1) == 0) {
                    spy.m_waiting = true;
                    spy._121_3_ = 0;
                    goto LAB_0019a206;
                  }
                  QTest::qWait(0x32);
                  local_13c = local_13c + 10;
                }
                QtMWidgets::ProgressBar::reset((ProgressBar *)local_a0);
                QTest::qWait(0x226);
                QtMWidgets::ProgressBar::setInvertedAppearance((ProgressBar *)local_a0,true);
                bVar2 = QtMWidgets::ProgressBar::invertedAppearance((ProgressBar *)local_a0);
                bVar1 = QTest::qVerify(bVar2,"p.invertedAppearance() == true","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                       ,0x72);
                if ((bVar1 & 1) == 0) {
                  spy.m_waiting = true;
                  spy._121_3_ = 0;
                }
                else {
                  local_140 = QtMWidgets::ProgressBar::minimum((ProgressBar *)local_a0);
                  while( true ) {
                    iVar3 = QtMWidgets::ProgressBar::maximum((ProgressBar *)local_a0);
                    if (iVar3 < local_140) break;
                    QtMWidgets::ProgressBar::setValue((ProgressBar *)local_a0,local_140);
                    iVar3 = QtMWidgets::ProgressBar::value((ProgressBar *)local_a0);
                    bVar1 = QTest::qVerify(iVar3 == local_140,"p.value() == i","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                           ,0x77);
                    if ((bVar1 & 1) == 0) {
                      spy.m_waiting = true;
                      spy._121_3_ = 0;
                      goto LAB_0019a206;
                    }
                    QTest::qWait(0x32);
                    local_140 = local_140 + 10;
                  }
                  spy.m_waiting = false;
                  spy._121_3_ = 0;
                }
              }
            }
          }
        }
      }
    }
LAB_0019a206:
    QSignalSpy::~QSignalSpy((QSignalSpy *)local_128);
  }
  QtMWidgets::ProgressBar::~ProgressBar((ProgressBar *)local_a0);
  QVBoxLayout::~QVBoxLayout(local_60);
  QWidget::~QWidget(local_38);
  return;
}

Assistant:

void testVertBar()
	{
		QWidget w;
		QVBoxLayout l;
		w.setLayout( &l );
		QtMWidgets::ProgressBar p;
		l.addWidget( &p );

		w.show();

		QVERIFY( QTest::qWaitForWindowActive( &w ) );

		QSignalSpy spy( &p, &QtMWidgets::ProgressBar::valueChanged );

		p.setMinimum( 0 );
		p.setMaximum( 100 );
		p.setValue( 1 );
		p.setOrientation( Qt::Vertical );

		w.resize( 50, 150 );

		QVERIFY( p.minimum() == 0 );
		QVERIFY( p.maximum() == 100 );
		QVERIFY( p.value() == 1 );
		QVERIFY( p.orientation() == Qt::Vertical );
		QVERIFY( p.invertedAppearance() == false );
		QVERIFY( spy.count() == 1 );

		for( int i = p.minimum(); i <= p.maximum(); i += 10 )
		{
			p.setValue( i );
			QVERIFY( p.value() == i );
			QTest::qWait( 50 );
		}

		p.reset();
		QTest::qWait( 550 );

		p.setInvertedAppearance( true );

		QVERIFY( p.invertedAppearance() == true );

		for( int i = p.minimum(); i <= p.maximum(); i += 10 )
		{
			p.setValue( i );
			QVERIFY( p.value() == i );
			QTest::qWait( 50 );
		}
	}